

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOIDecPOMDPDiscrete::SetIndividualDecPOMDPD
          (TOIDecPOMDPDiscrete *this,DecPOMDPDiscrete *model,Index agentI)

{
  size_type sVar1;
  reference ppDVar2;
  uint in_EDX;
  value_type in_RSI;
  size_type in_RDI;
  vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_> *unaff_retaddr;
  size_type __new_size;
  
  __new_size = in_RDI;
  sVar1 = std::vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>::size
                    ((vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_> *)
                     (in_RDI + 0x2a0));
  if (sVar1 <= in_EDX) {
    std::vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>::resize
              (unaff_retaddr,__new_size);
  }
  ppDVar2 = std::vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>::operator[]
                      ((vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_> *)
                       (in_RDI + 0x2a0),(ulong)in_EDX);
  *ppDVar2 = in_RSI;
  return;
}

Assistant:

void TOIDecPOMDPDiscrete::SetIndividualDecPOMDPD(DecPOMDPDiscrete *model,
                                                 Index agentI)
{
    if(_m_individualDecPOMDPDs.size()<=agentI)
        _m_individualDecPOMDPDs.resize(agentI+1);

    _m_individualDecPOMDPDs[agentI]=model;
}